

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

void __thiscall ON_Viewport::Dump(ON_Viewport *this,ON_TextLog *dump)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  double x;
  double port_aspect;
  double local_30;
  
  ON_TextLog::Print(dump,"ON_Viewport\n");
  ON_TextLog::PushIndent(dump);
  ON_TextLog::Print(dump,"Projection: ");
  pcVar1 = "invalid\n";
  if (this->m_projection == perspective_view) {
    pcVar1 = "perspective\n";
  }
  pcVar2 = "parallel\n";
  if (this->m_projection != parallel_view) {
    pcVar2 = pcVar1;
  }
  ON_TextLog::Print(dump,pcVar2);
  pcVar2 = "false";
  pcVar1 = "false";
  if (this->m_bValidCamera != false) {
    pcVar1 = "true";
  }
  ON_TextLog::Print(dump,"Camera: (m_bValidCamera = %s)\n",pcVar1);
  ON_TextLog::PushIndent(dump);
  ON_TextLog::Print(dump,"Location: ");
  if (this->m_bLockCamLoc == true) {
    ON_TextLog::Print(dump,"(locked) ");
  }
  ON_TextLog::Print(dump,&this->m_CamLoc);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Direction: ");
  if (this->m_bLockCamDir == true) {
    ON_TextLog::Print(dump,"(locked) ");
  }
  ON_TextLog::Print(dump,&this->m_CamDir);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Up: ");
  if (this->m_bLockCamUp == true) {
    ON_TextLog::Print(dump,"(locked) ");
  }
  ON_TextLog::Print(dump,&this->m_CamUp);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"X: ");
  ON_TextLog::Print(dump,&this->m_CamX);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Y: ");
  ON_TextLog::Print(dump,&this->m_CamY);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Z: ");
  ON_TextLog::Print(dump,&this->m_CamZ);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"Target Point: ");
  ON_TextLog::Print(dump,&this->m_target_point);
  ON_TextLog::Print(dump,"\n");
  TargetDistance(this,true);
  ON_TextLog::Print(dump,"target distance %g\n");
  x = 0.0;
  pcVar1 = "false";
  if (this->m_bValidFrustum == true) {
    dVar3 = this->m_frus_top - this->m_frus_bottom;
    pcVar1 = "true";
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      x = (this->m_frus_right - this->m_frus_left) / dVar3;
      pcVar1 = "true";
    }
  }
  ON_TextLog::Print(dump,"Frustum: (m_bValidFrustum = %s)\n",pcVar1);
  ON_TextLog::PushIndent(dump);
  pcVar1 = "false";
  if ((this->m_frustum_symmetry_flags & 2) != 0) {
    pcVar1 = "true";
  }
  ON_TextLog::Print(dump,"left/right symmetry locked = %s\n",pcVar1);
  if ((this->m_frustum_symmetry_flags & 1) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(dump,"top/bottom symmetry locked = %s\n",pcVar2);
  ON_TextLog::Print(dump,"left: ");
  ON_TextLog::Print(dump,this->m_frus_left);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"right: ");
  ON_TextLog::Print(dump,this->m_frus_right);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"bottom: ");
  ON_TextLog::Print(dump,this->m_frus_bottom);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"top: ");
  ON_TextLog::Print(dump,this->m_frus_top);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"near: ");
  ON_TextLog::Print(dump,this->m_frus_near);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"far: ");
  ON_TextLog::Print(dump,this->m_frus_far);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"aspect (width/height): ");
  ON_TextLog::Print(dump,x);
  ON_TextLog::Print(dump,"\n");
  if (this->m_projection == perspective_view) {
    ON_TextLog::PushIndent(dump);
    ON_TextLog::Print(dump,"near/far: %g\n",this->m_frus_near / this->m_frus_far);
    ON_TextLog::Print(dump,"suggested minimum near: = %g\n",this->m__MIN_NEAR_DIST);
    ON_TextLog::Print(dump,"suggested minimum near/far: = %g\n",this->m__MIN_NEAR_OVER_FAR);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  local_30 = 0.0;
  GetScreenPortAspect(this,&local_30);
  pcVar1 = "false";
  if (this->m_bValidPort != false) {
    pcVar1 = "true";
  }
  ON_TextLog::Print(dump,"Port: (m_bValidPort = %s\n",pcVar1);
  ON_TextLog::PushIndent(dump);
  ON_TextLog::Print(dump,"left: %d\n",(ulong)(uint)this->m_port_left);
  ON_TextLog::Print(dump,"right: %d\n",(ulong)(uint)this->m_port_right);
  ON_TextLog::Print(dump,"bottom: %d\n",(ulong)(uint)this->m_port_bottom);
  ON_TextLog::Print(dump,"top: %d\n",(ulong)(uint)this->m_port_top);
  ON_TextLog::Print(dump,"near: %d\n",(ulong)(uint)this->m_port_near);
  ON_TextLog::Print(dump,"far: %d\n",(ulong)(uint)this->m_port_far);
  ON_TextLog::Print(dump,"aspect (width/height): ");
  ON_TextLog::Print(dump,local_30);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::PopIndent(dump);
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_Viewport::Dump( ON_TextLog& dump ) const
{
  dump.Print("ON_Viewport\n");
  dump.PushIndent();

  dump.Print("Projection: ");
  switch(m_projection)
  {
  case ON::parallel_view:
    dump.Print("parallel\n");
    break;
  case ON::perspective_view:
    dump.Print("perspective\n");
    break;
  default:
    dump.Print("invalid\n");
    break;
  }
  dump.Print("Camera: (m_bValidCamera = %s)\n",(m_bValidCamera?"true":"false"));
  dump.PushIndent();
  dump.Print("Location: "); if ( CameraLocationIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamLoc); dump.Print("\n");
  dump.Print("Direction: "); if ( CameraDirectionIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamDir); dump.Print("\n");
  dump.Print("Up: "); if ( CameraUpIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamUp); dump.Print("\n");
  dump.Print("X: "); dump.Print(m_CamX); dump.Print("\n");
  dump.Print("Y: "); dump.Print(m_CamY); dump.Print("\n");
  dump.Print("Z: "); dump.Print(m_CamZ); dump.Print("\n");
  dump.PopIndent();
  dump.Print("Target Point: "); dump.Print(m_target_point); dump.Print("\n");
  dump.Print("target distance %g\n",TargetDistance(true));

  double frus_aspect=0.0;
  GetFrustumAspect(frus_aspect);
  dump.Print("Frustum: (m_bValidFrustum = %s)\n",(m_bValidFrustum?"true":"false"));
  dump.PushIndent();
  dump.Print("left/right symmetry locked = %s\n",FrustumIsLeftRightSymmetric()?"true":"false");
  dump.Print("top/bottom symmetry locked = %s\n",FrustumIsTopBottomSymmetric()?"true":"false");
  dump.Print("left: "); dump.Print(m_frus_left); dump.Print("\n");
  dump.Print("right: "); dump.Print(m_frus_right); dump.Print("\n");
  dump.Print("bottom: "); dump.Print(m_frus_bottom); dump.Print("\n");
  dump.Print("top: "); dump.Print(m_frus_top); dump.Print("\n");
  dump.Print("near: "); dump.Print(m_frus_near); dump.Print("\n");
  dump.Print("far: "); dump.Print(m_frus_far); dump.Print("\n");
  dump.Print("aspect (width/height): "); dump.Print(frus_aspect); dump.Print("\n");
  if ( ON::perspective_view == m_projection )
  {
    dump.PushIndent();
    dump.Print("near/far: %g\n",m_frus_near/m_frus_far);
    dump.Print("suggested minimum near: = %g\n",m__MIN_NEAR_DIST);
    dump.Print("suggested minimum near/far: = %g\n",m__MIN_NEAR_OVER_FAR);
    dump.PopIndent();
  }
  dump.PopIndent();

  double port_aspect=0.0;
  GetScreenPortAspect(port_aspect);
  dump.Print("Port: (m_bValidPort = %s\n",(m_bValidPort?"true":"false"));
  dump.PushIndent();
  dump.Print("left: %d\n",m_port_left);
  dump.Print("right: %d\n",m_port_right);
  dump.Print("bottom: %d\n",m_port_bottom);
  dump.Print("top: %d\n",m_port_top);
  dump.Print("near: %d\n",m_port_near);
  dump.Print("far: %d\n",m_port_far);
  dump.Print("aspect (width/height): "); dump.Print(port_aspect); dump.Print("\n");
  dump.PopIndent();

  dump.PopIndent();
}